

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::ColoredWriteToStderrOrStdout
               (FILE *output,LogSeverity severity,char *message,size_t len)

{
  char *pcVar1;
  size_t sStack_30;
  
  sStack_30 = len;
  if (LogDestination::terminal_supports_color_ == '\x01') {
    if (_stdout == output) {
      if (fLB::FLAGS_colorlogtostdout != '\x01') goto LAB_0011b06e;
    }
    else if (fLB::FLAGS_colorlogtostderr == '\0') goto LAB_0011b06e;
    if (severity - ERROR < 2) {
      pcVar1 = "1";
    }
    else {
      if (severity == GLOG_INFO) goto LAB_0011b06e;
      if (severity != GLOG_WARNING) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/logging.cc"
                      ,0xec,"GLogColor google::SeverityToColor(LogSeverity)");
      }
      pcVar1 = "3";
    }
    fprintf((FILE *)output,"\x1b[0;3%sm",pcVar1);
    fwrite(message,len,1,(FILE *)output);
    message = "\x1b[m";
    sStack_30 = 3;
  }
LAB_0011b06e:
  fwrite(message,sStack_30,1,(FILE *)output);
  return;
}

Assistant:

static void ColoredWriteToStderrOrStdout(FILE* output, LogSeverity severity,
                                         const char* message, size_t len) {
  bool is_stdout = (output == stdout);
  const GLogColor color = (LogDestination::terminal_supports_color() &&
                           ((!is_stdout && FLAGS_colorlogtostderr) ||
                            (is_stdout && FLAGS_colorlogtostdout)))
                              ? SeverityToColor(severity)
                              : COLOR_DEFAULT;

  // Avoid using cerr from this module since we may get called during
  // exit code, and cerr may be partially or fully destroyed by then.
  if (COLOR_DEFAULT == color) {
    fwrite(message, len, 1, output);
    return;
  }
#ifdef GLOG_OS_WINDOWS
  const HANDLE output_handle =
      GetStdHandle(is_stdout ? STD_OUTPUT_HANDLE : STD_ERROR_HANDLE);

  // Gets the current text color.
  CONSOLE_SCREEN_BUFFER_INFO buffer_info;
  GetConsoleScreenBufferInfo(output_handle, &buffer_info);
  const WORD old_color_attrs = buffer_info.wAttributes;

  // We need to flush the stream buffers into the console before each
  // SetConsoleTextAttribute call lest it affect the text that is already
  // printed but has not yet reached the console.
  fflush(output);
  SetConsoleTextAttribute(output_handle,
                          GetColorAttribute(color) | FOREGROUND_INTENSITY);
  fwrite(message, len, 1, output);
  fflush(output);
  // Restores the text color.
  SetConsoleTextAttribute(output_handle, old_color_attrs);
#else
  fprintf(output, "\033[0;3%sm", GetAnsiColorCode(color));
  fwrite(message, len, 1, output);
  fprintf(output, "\033[m");  // Resets the terminal to default.
#endif  // GLOG_OS_WINDOWS
}